

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.h
# Opt level: O0

KcpTcpEventLoop * __thiscall
sznet::CheckNotNull<sznet::net::KcpTcpEventLoop>
          (sznet *this,SourceFile file,int line,char *names,KcpTcpEventLoop *ptr)

{
  LogStream *this_00;
  undefined4 in_register_0000000c;
  SourceFile file_00;
  Logger local_1000;
  KcpTcpEventLoop *local_30;
  KcpTcpEventLoop *ptr_local;
  char *names_local;
  sznet *psStack_18;
  int line_local;
  SourceFile file_local;
  
  ptr_local = (KcpTcpEventLoop *)CONCAT44(in_register_0000000c,line);
  file_local.m_data._0_4_ = file.m_data._0_4_;
  names_local._4_4_ = file.m_size;
  local_30 = (KcpTcpEventLoop *)names;
  if (names == (char *)0x0) {
    file_00.m_size = file_local.m_data._0_4_;
    file_00.m_data = (char *)this;
    file_00._12_4_ = 0;
    psStack_18 = this;
    Logger::Logger(&local_1000,file_00,names_local._4_4_,FATAL);
    this_00 = Logger::stream(&local_1000);
    LogStream::operator<<(this_00,(char *)ptr_local);
    Logger::~Logger(&local_1000);
  }
  return local_30;
}

Assistant:

T* CheckNotNull(Logger::SourceFile file, int line, const char* names, T* ptr)
{
	if (ptr == nullptr)
	{
		Logger(file, line, Logger::FATAL).stream() << names;
	}
	return ptr;
}